

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

bool amrex::anon_unknown_12::anon_unknown_0::squeryarr<float>
               (Table *table,string *name,vector<float,_std::allocator<float>_> *ptr,int start_ix,
               int num_val,int occurrence)

{
  bool bVar1;
  PP_entry *pp;
  ostream *poVar2;
  long lVar3;
  string *str;
  char *pcVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  pp = ppindex(table,occurrence,name,false);
  if (pp != (PP_entry *)0x0) {
    if (num_val == -1) {
      num_val = (int)((ulong)((long)(pp->m_vals).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pp->m_vals).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5);
    }
    if (num_val != 0) {
      iVar5 = num_val + start_ix;
      if ((int)((ulong)(*(long *)(ptr + 8) - *(long *)ptr) >> 2) < iVar5) {
        std::vector<float,_std::allocator<float>_>::resize(ptr,(long)iVar5);
      }
      if ((int)((ulong)((long)(pp->m_vals).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pp->m_vals).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) < iVar5) {
        poVar2 = ErrorStream();
        std::operator<<(poVar2,"ParmParse::queryarr too many values requested for");
        poVar2 = ErrorStream();
        if (occurrence == -1) {
          pcVar4 = " last occurrence of ";
        }
        else {
          poVar2 = std::operator<<(poVar2," occurrence ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,occurrence);
          pcVar4 = " of ";
        }
        std::operator<<(poVar2,pcVar4);
        poVar2 = ErrorStream();
        poVar2 = std::operator<<(poVar2,(string *)pp);
        poVar2 = std::operator<<(poVar2,'\n');
        amrex::operator<<(poVar2,pp);
        std::operator<<(poVar2,'\n');
        Abort_host((char *)0x0);
      }
      lVar6 = (long)start_ix;
      lVar3 = lVar6 << 5;
      lVar7 = lVar6 * 4;
      for (; lVar6 < iVar5; lVar6 = lVar6 + 1) {
        str = (string *)
              ((long)&(((pp->m_vals).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3);
        bVar1 = is<float>(str,(float *)(*(long *)ptr + lVar7));
        if (!bVar1) {
          poVar2 = ErrorStream();
          poVar2 = std::operator<<(poVar2,"ParmParse::queryarr type mismatch on value number ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar6);
          std::operator<<(poVar2," of ");
          poVar2 = ErrorStream();
          if (occurrence == -1) {
            pcVar4 = " last occurrence of ";
          }
          else {
            poVar2 = std::operator<<(poVar2," occurrence number ");
            poVar2 = (ostream *)std::ostream::operator<<(poVar2,occurrence);
            pcVar4 = " of ";
          }
          std::operator<<(poVar2,pcVar4);
          poVar2 = ErrorStream();
          poVar2 = std::operator<<(poVar2,(string *)pp);
          std::operator<<(poVar2,'\n');
          poVar2 = ErrorStream();
          poVar2 = std::operator<<(poVar2," Expected an \"");
          poVar2 = std::operator<<(poVar2,_fread + (*_fread == '*'));
          poVar2 = std::operator<<(poVar2,"\" type which can\'t be parsed from the string \"");
          poVar2 = std::operator<<(poVar2,(string *)str);
          poVar2 = std::operator<<(poVar2,"\"\n");
          amrex::operator<<(poVar2,pp);
          std::operator<<(poVar2,'\n');
          Abort_host((char *)0x0);
        }
        lVar3 = lVar3 + 0x20;
        lVar7 = lVar7 + 4;
      }
    }
  }
  return pp != (PP_entry *)0x0;
}

Assistant:

bool
squeryarr (const ParmParse::Table& table,
           const std::string& name,
           std::vector<T>&    ptr,
           int          start_ix,
           int          num_val,
           int          occurrence)
{
    //
    // Get last occurrence of name in table.
    //
    const ParmParse::PP_entry *def = ppindex(table,occurrence, name, false);
    if ( def == 0 )
    {
        return false;
    }
    //
    // Does it have sufficient number of values and are they all
    // the same type?
    //
    if ( num_val == ParmParse::ALL )
    {
        num_val = def->m_vals.size();
    }

    if ( num_val == 0 ) return true;

    int stop_ix = start_ix + num_val - 1;
    if ( static_cast<int>(ptr.size()) <= stop_ix )
    {
        ptr.resize(stop_ix + 1);
    }
    if ( stop_ix >= static_cast<int>(def->m_vals.size()) )
    {
        amrex::ErrorStream() << "ParmParse::queryarr too many values requested for";
        if ( occurrence == ParmParse::LAST )
        {
            amrex::ErrorStream() << " last occurrence of ";
        }
        else
        {
            amrex::ErrorStream() << " occurrence " << occurrence << " of ";
        }
        amrex::ErrorStream() << def->m_name << '\n' << *def << '\n';
        amrex::Abort();
    }
    for ( int n = start_ix; n <= stop_ix; n++ )
    {
        const std::string& valname = def->m_vals[n];
        bool ok = is(valname, ptr[n]);
        if ( !ok )
        {
            amrex::ErrorStream() << "ParmParse::queryarr type mismatch on value number "
                      <<  n << " of ";
            if ( occurrence == ParmParse::LAST )
            {
                amrex::ErrorStream() << " last occurrence of ";
            }
            else
            {
                amrex::ErrorStream() << " occurrence number " << occurrence << " of ";
            }
            amrex::ErrorStream() << def->m_name << '\n';
            amrex::ErrorStream() << " Expected an \""
                      << tok_name(ptr)
                      << "\" type which can't be parsed from the string \""
                      << valname << "\"\n"
                      << *def << '\n';
            amrex::Abort();
        }
    }
    return true;
}